

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.hpp
# Opt level: O0

BaseSymbol * __thiscall symbol_table_visitor::Find(symbol_table_visitor *this,string *name)

{
  size_type sVar1;
  mapped_type *ppBVar2;
  bool bVar3;
  mapped_type local_30;
  BaseScope *local_20;
  BaseScope *scope;
  string *name_local;
  symbol_table_visitor *this_local;
  
  local_20 = this->curr_scope;
  while( true ) {
    bVar3 = false;
    if (local_20 != (BaseScope *)0x0) {
      sVar1 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>_>_>
              ::count(&local_20->symbols,name);
      bVar3 = sVar1 == 0;
    }
    if (!bVar3) break;
    local_20 = local_20->parent;
  }
  if (local_20 == (BaseScope *)0x0) {
    local_30 = (mapped_type)0x0;
  }
  else {
    ppBVar2 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>_>_>
              ::operator[](&local_20->symbols,name);
    local_30 = *ppBVar2;
  }
  return local_30;
}

Assistant:

BaseSymbol* Find(const std::string& name) {
        BaseScope* scope = curr_scope;
        while (scope != nullptr && scope->symbols.count(name) == 0)
            scope = scope->parent;
        
        return scope == nullptr ? nullptr : scope->symbols[name];
    }